

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O3

void Assimp::PLYImporter::GetMaterialColor
               (vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                *avList,uint *aiPositions,EDataType *aiTypes,aiColor4D *clrOut)

{
  pointer pPVar1;
  ulong uVar2;
  runtime_error *prVar3;
  ulong uVar4;
  float fVar5;
  ai_real aVar6;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (clrOut == (aiColor4D *)0x0) {
    __assert_fail("__null != clrOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyLoader.cpp"
                  ,0x2b2,
                  "static void Assimp::PLYImporter::GetMaterialColor(const std::vector<PLY::PropertyInstance> &, unsigned int *, PLY::EDataType *, aiColor4D *)"
                 );
  }
  uVar2 = (ulong)(int)*aiPositions;
  fVar5 = 0.0;
  if (uVar2 != 0xffffffffffffffff) {
    pPVar1 = (avList->
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(avList->
                   super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) *
            -0x5555555555555555;
    if (uVar4 < uVar2 || uVar4 - uVar2 == 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar3,(string *)local_50);
      *(undefined ***)prVar3 = &PTR__runtime_error_00875f28;
      __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    fVar5 = NormalizeColorValue(**(ValueUnion **)
                                  &pPVar1[uVar2].avList.
                                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ._M_impl,*aiTypes);
  }
  aVar6 = 0.0;
  clrOut->r = fVar5;
  uVar2 = (ulong)(int)aiPositions[1];
  if (uVar2 != 0xffffffffffffffff) {
    pPVar1 = (avList->
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(avList->
                   super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) *
            -0x5555555555555555;
    if (uVar4 < uVar2 || uVar4 - uVar2 == 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar3,(string *)local_50);
      *(undefined ***)prVar3 = &PTR__runtime_error_00875f28;
      __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    aVar6 = NormalizeColorValue(**(ValueUnion **)
                                  &pPVar1[uVar2].avList.
                                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ._M_impl,aiTypes[1]);
  }
  clrOut->g = aVar6;
  uVar2 = (ulong)(int)aiPositions[2];
  if (uVar2 == 0xffffffffffffffff) {
    fVar5 = 0.0;
  }
  else {
    pPVar1 = (avList->
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(avList->
                   super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) *
            -0x5555555555555555;
    if (uVar4 < uVar2 || uVar4 - uVar2 == 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar3,(string *)local_50);
      *(undefined ***)prVar3 = &PTR__runtime_error_00875f28;
      __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    fVar5 = NormalizeColorValue(**(ValueUnion **)
                                  &pPVar1[uVar2].avList.
                                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ._M_impl,aiTypes[2]);
  }
  clrOut->b = fVar5;
  uVar2 = (ulong)(int)aiPositions[3];
  if (uVar2 == 0xffffffffffffffff) {
    fVar5 = 1.0;
  }
  else {
    pPVar1 = (avList->
             super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(avList->
                   super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) *
            -0x5555555555555555;
    if (uVar4 < uVar2 || uVar4 - uVar2 == 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Invalid .ply file: Property index is out of range.","");
      std::runtime_error::runtime_error(prVar3,(string *)local_50);
      *(undefined ***)prVar3 = &PTR__runtime_error_00875f28;
      __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    fVar5 = NormalizeColorValue(**(ValueUnion **)
                                  &pPVar1[uVar2].avList.
                                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                   ._M_impl,aiTypes[3]);
  }
  clrOut->a = fVar5;
  return;
}

Assistant:

void PLYImporter::GetMaterialColor(const std::vector<PLY::PropertyInstance>& avList,
  unsigned int aiPositions[4],
  PLY::EDataType aiTypes[4],
  aiColor4D* clrOut)
{
  ai_assert(NULL != clrOut);

  if (0xFFFFFFFF == aiPositions[0])clrOut->r = 0.0f;
  else
  {
    clrOut->r = NormalizeColorValue(GetProperty(avList,
      aiPositions[0]).avList.front(), aiTypes[0]);
  }

  if (0xFFFFFFFF == aiPositions[1])clrOut->g = 0.0f;
  else
  {
    clrOut->g = NormalizeColorValue(GetProperty(avList,
      aiPositions[1]).avList.front(), aiTypes[1]);
  }

  if (0xFFFFFFFF == aiPositions[2])clrOut->b = 0.0f;
  else
  {
    clrOut->b = NormalizeColorValue(GetProperty(avList,
      aiPositions[2]).avList.front(), aiTypes[2]);
  }

  // assume 1.0 for the alpha channel ifit is not set
  if (0xFFFFFFFF == aiPositions[3])clrOut->a = 1.0f;
  else
  {
    clrOut->a = NormalizeColorValue(GetProperty(avList,
      aiPositions[3]).avList.front(), aiTypes[3]);
  }
}